

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

boundaries *
nlohmann::detail::dtoa_impl::compute_boundaries<double>
          (boundaries *__return_storage_ptr__,double value)

{
  diyfp *pdVar1;
  long lVar2;
  diyfp *this;
  uint uVar3;
  bool bVar4;
  diyfp dVar5;
  diyfp dVar6;
  diyfp dVar7;
  diyfp m_minus;
  diyfp local_40;
  
  if (0x7fefffffffffffff < (ulong)ABS(value)) {
    __assert_fail("std::isfinite(value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                  ,0x2155,
                  "boundaries nlohmann::detail::dtoa_impl::compute_boundaries(FloatType) [FloatType = double]"
                 );
  }
  if (0.0 < value) {
    pdVar1 = (diyfp *)((ulong)value & 0xfffffffffffff);
    bVar4 = (ulong)value >> 0x34 == 0;
    this = (diyfp *)((ulong)pdVar1 | 0x10000000000000);
    if (bVar4) {
      this = pdVar1;
    }
    uVar3 = 0xfffffbce;
    if (!bVar4) {
      uVar3 = (uint)((ulong)value >> 0x34) - 0x433;
    }
    bVar4 = (ulong)value >> 0x35 == 0;
    dVar5.f = (ulong)(uVar3 - 1);
    lVar2 = (long)this * 4;
    if (bVar4 || pdVar1 != (diyfp *)0x0) {
      lVar2 = (long)this * 2;
    }
    local_40.e = uVar3 - 2;
    if (bVar4 || pdVar1 != (diyfp *)0x0) {
      local_40.e = uVar3 - 1;
    }
    local_40.f = lVar2 - 1;
    dVar5._8_8_ = (long)this * 2;
    dVar5 = diyfp::normalize((diyfp *)((long)this * 2 + 1),dVar5);
    dVar6 = diyfp::normalize_to(&local_40,dVar5.e);
    dVar7._8_8_ = dVar6._8_8_;
    dVar7.f = (ulong)uVar3;
    dVar7 = diyfp::normalize(this,dVar7);
    (__return_storage_ptr__->w).f = dVar7.f;
    (__return_storage_ptr__->w).e = dVar7.e;
    (__return_storage_ptr__->minus).f = dVar6.f;
    (__return_storage_ptr__->minus).e = dVar6.e;
    (__return_storage_ptr__->plus).f = dVar5.f;
    (__return_storage_ptr__->plus).e = dVar5.e;
    return __return_storage_ptr__;
  }
  __assert_fail("value > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                ,0x2156,
                "boundaries nlohmann::detail::dtoa_impl::compute_boundaries(FloatType) [FloatType = double]"
               );
}

Assistant:

boundaries compute_boundaries(FloatType value) {
	assert(std::isfinite(value));
	assert(value > 0);

	// Convert the IEEE representation into a diyfp.
	//
	// If v is denormal:
	//      value = 0.F * 2^(1 - bias) = (          F) * 2^(1 - bias - (p-1))
	// If v is normalized:
	//      value = 1.F * 2^(E - bias) = (2^(p-1) + F) * 2^(E - bias - (p-1))

	static_assert(std::numeric_limits<FloatType>::is_iec559,
				  "internal error: dtoa_short requires an IEEE-754 floating-point implementation");

	constexpr int kPrecision = std::numeric_limits<FloatType>::digits;  // = p (includes the hidden bit)
	constexpr int kBias = std::numeric_limits<FloatType>::max_exponent - 1 + (kPrecision - 1);
	constexpr int kMinExp = 1 - kBias;
	constexpr uint64_t kHiddenBit = uint64_t{1} << (kPrecision - 1);  // = 2^(p-1)

	using bits_type = typename std::conditional<kPrecision == 24, uint32_t, uint64_t>::type;

	const uint64_t bits = reinterpret_bits<bits_type>(value);
	const uint64_t E = bits >> (kPrecision - 1);
	const uint64_t F = bits & (kHiddenBit - 1);

	const bool is_denormal = (E == 0);
	const diyfp v = is_denormal ? diyfp(F, kMinExp) : diyfp(F + kHiddenBit, static_cast<int>(E) - kBias);

	// Compute the boundaries m- and m+ of the floating-point value
	// v = f * 2^e.
	//
	// Determine v- and v+, the floating-point predecessor and successor if v,
	// respectively.
	//
	//      v- = v - 2^e        if f != 2^(p-1) or e == e_min                (A)
	//         = v - 2^(e-1)    if f == 2^(p-1) and e > e_min                (B)
	//
	//      v+ = v + 2^e
	//
	// Let m- = (v- + v) / 2 and m+ = (v + v+) / 2. All real numbers _strictly_
	// between m- and m+ round to v, regardless of how the input rounding
	// algorithm breaks ties.
	//
	//      ---+-------------+-------------+-------------+-------------+---  (A)
	//         v-            m-            v             m+            v+
	//
	//      -----------------+------+------+-------------+-------------+---  (B)
	//                       v-     m-     v             m+            v+

	const bool lower_boundary_is_closer = (F == 0 and E > 1);
	const diyfp m_plus = diyfp(2 * v.f + 1, v.e - 1);
	const diyfp m_minus = lower_boundary_is_closer ? diyfp(4 * v.f - 1, v.e - 2)  // (B)
												   : diyfp(2 * v.f - 1, v.e - 1);  // (A)

	// Determine the normalized w+ = m+.
	const diyfp w_plus = diyfp::normalize(m_plus);

	// Determine w- = m- such that e_(w-) = e_(w+).
	const diyfp w_minus = diyfp::normalize_to(m_minus, w_plus.e);

	return {diyfp::normalize(v), w_minus, w_plus};
}